

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  _xmlNode *p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  xmlXIncludeRefPtr pxVar5;
  xmlNodePtr pxVar6;
  ulong uVar7;
  xmlNodePtr elem;
  char *pcVar8;
  _xmlNode *p_Var9;
  xmlNodePtr cur;
  char *extra;
  long lVar10;
  _xmlNode **pp_Var11;
  
  iVar2 = -1;
  if ((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) {
    lVar10 = (long)ctxt->incNr;
    p_Var9 = tree;
    do {
      if (((p_Var9->type == XML_ELEMENT_NODE) && (p_Var9->ns != (xmlNs *)0x0)) &&
         ((iVar2 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
          iVar2 != 0 ||
          (iVar2 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
          iVar2 != 0)))) {
        iVar2 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude");
        if ((iVar2 != 0) && (ctxt->legacy == 0)) {
          ctxt->legacy = 1;
        }
        iVar2 = xmlStrEqual(p_Var9->name,(xmlChar *)"include");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(p_Var9->name,(xmlChar *)"fallback");
          if ((iVar2 != 0) &&
             ((((p_Var1 = p_Var9->parent, p_Var1 == (_xmlNode *)0x0 ||
                (p_Var1->type != XML_ELEMENT_NODE)) || (p_Var1->ns == (xmlNs *)0x0)) ||
              (((iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
                iVar2 == 0 &&
                (iVar2 = xmlStrEqual(p_Var9->parent->ns->href,
                                     (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar2 == 0)) ||
               (iVar2 = xmlStrEqual(p_Var9->parent->name,(xmlChar *)"include"), iVar2 == 0)))))) {
            iVar2 = 0x650;
            pcVar8 = "%s is not the child of an \'include\'\n";
            extra = "fallback";
            goto LAB_0018f9e4;
          }
          goto LAB_0018f9e9;
        }
        iVar2 = 0;
        pp_Var11 = &p_Var9->children;
        while (p_Var1 = *pp_Var11, p_Var1 != (_xmlNode *)0x0) {
          if (((p_Var1->type == XML_ELEMENT_NODE) && (p_Var1->ns != (xmlNs *)0x0)) &&
             ((iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
              iVar3 != 0 ||
              (iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
              iVar3 != 0)))) {
            iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"include");
            if (iVar3 != 0) {
              iVar2 = 0x64e;
              pcVar8 = "%s has an \'include\' child\n";
              goto LAB_0018f9dd;
            }
            iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"fallback");
            iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
          }
          pp_Var11 = &p_Var1->next;
        }
        if (1 < iVar2) {
          iVar2 = 0x64f;
          pcVar8 = "%s has multiple fallback children\n";
LAB_0018f9dd:
          extra = "include";
LAB_0018f9e4:
          xmlXIncludeErr(ctxt,p_Var9,iVar2,pcVar8,(xmlChar *)extra);
          goto LAB_0018f9e9;
        }
        ctxt->incTotal = ctxt->incTotal + 1;
        pxVar5 = xmlXIncludeExpandNode(ctxt,p_Var9);
        if (pxVar5 != (xmlXIncludeRefPtr)0x0) {
          pxVar5->replace = 1;
        }
LAB_0018f9fe:
        while ((pxVar6 = p_Var9, p_Var9 != tree &&
               (pxVar6 = p_Var9->next, p_Var9->next == (xmlNodePtr)0x0))) {
          p_Var9 = p_Var9->parent;
          if (p_Var9 == (_xmlNode *)0x0) goto LAB_0018fa2b;
        }
      }
      else {
LAB_0018f9e9:
        if ((p_Var9->children == (xmlNodePtr)0x0) ||
           (pxVar6 = p_Var9->children, (p_Var9->type | XML_COMMENT_NODE) != XML_DOCUMENT_NODE))
        goto LAB_0018f9fe;
      }
    } while ((pxVar6 != (xmlNodePtr)0x0) && (p_Var9 = pxVar6, pxVar6 != tree));
LAB_0018fa2b:
    iVar2 = 0;
    for (; uVar7 = (ulong)ctxt->incNr, lVar10 < (long)uVar7; lVar10 = lVar10 + 1) {
      pxVar5 = ctxt->incTab[lVar10];
      pxVar6 = pxVar5->inc;
      if (pxVar5->replace == 0) {
        if (pxVar6 != (xmlNodePtr)0x0) {
          xmlFreeNodeList(pxVar6);
          ctxt->incTab[lVar10]->inc = (xmlNodePtr)0x0;
        }
      }
      else {
        if ((((pxVar6 != (xmlNodePtr)0x0) || (pxVar5->emptyFb != 0)) &&
            (cur = pxVar5->elem, cur != (xmlNodePtr)0x0)) && (cur->type != XML_NAMESPACE_DECL)) {
          pxVar5->inc = (xmlNodePtr)0x0;
          pxVar5->emptyFb = 0;
          if ((cur->parent == (_xmlNode *)0x0) || (cur->parent->type == XML_ELEMENT_NODE)) {
LAB_0018fae0:
            if ((ctxt->parseFlags & 0x8000) == 0) {
              if (pxVar5->fallback != 0) {
                xmlUnsetProp(cur,"href");
              }
              cur->type = XML_XINCLUDE_START;
              p_Var9 = cur->children;
              while (p_Var9 != (xmlNodePtr)0x0) {
                p_Var1 = p_Var9->next;
                xmlUnlinkNode(p_Var9);
                xmlFreeNode(p_Var9);
                p_Var9 = p_Var1;
              }
              elem = xmlNewDocNode(cur->doc,cur->ns,cur->name,(xmlChar *)0x0);
              if (elem == (xmlNodePtr)0x0) {
                cur = pxVar5->elem;
                iVar3 = 0x649;
                pcVar8 = "failed to build node\n";
                goto LAB_0018fbc7;
              }
              elem->type = XML_XINCLUDE_END;
              xmlAddNextSibling(cur,elem);
              while (pxVar6 != (xmlNodePtr)0x0) {
                p_Var9 = pxVar6->next;
                xmlAddPrevSibling(elem,pxVar6);
                pxVar6 = p_Var9;
              }
            }
            else {
              while (pxVar6 != (xmlNodePtr)0x0) {
                p_Var9 = pxVar6->next;
                xmlAddPrevSibling(cur,pxVar6);
                pxVar6 = p_Var9;
              }
              xmlUnlinkNode(cur);
              xmlFreeNode(cur);
            }
          }
          else {
            uVar4 = 0;
            for (p_Var9 = pxVar6; p_Var9 != (xmlNodePtr)0x0; p_Var9 = p_Var9->next) {
              uVar4 = uVar4 + (p_Var9->type == XML_ELEMENT_NODE);
            }
            if (uVar4 < 2) goto LAB_0018fae0;
            iVar3 = 0x64b;
            pcVar8 = "XInclude error: would result in multiple root nodes\n";
LAB_0018fbc7:
            xmlXIncludeErr(ctxt,cur,iVar3,pcVar8,(xmlChar *)0x0);
            xmlFreeNodeList(pxVar6);
          }
        }
        ctxt->incTab[lVar10]->replace = 0;
      }
      iVar2 = iVar2 + 1;
    }
    if (ctxt->isStream != 0) {
      for (lVar10 = 0; lVar10 < (int)uVar7; lVar10 = lVar10 + 1) {
        xmlXIncludeFreeRef(ctxt->incTab[lVar10]);
        uVar7 = (ulong)(uint)ctxt->incNr;
      }
      ctxt->incNr = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return(-1);
    if (ctxt == NULL)
	return(-1);

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
            /*
             * Avoid superlinear expansion by limiting the total number
             * of replacements.
             */
            if (ctxt->incTotal >= 20)
                break;
#endif
            ctxt->incTotal++;
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            if ((ctxt->incTab[i]->inc != NULL) ||
                (ctxt->incTab[i]->emptyFb != 0)) {	/* (empty fallback) */
                xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            }
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}